

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_INCDEC_r(DisasContext_conflict1 *s,arg_incdec_cnt *a)

{
  TCGContext_conflict1 *tcg_ctx;
  int iVar1;
  _Bool _Var2;
  undefined1 extraout_AL;
  uint uVar3;
  int iVar4;
  TCGv_i64 ret;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    uVar3 = decode_pred_count(s->sve_len,a->pat,a->esz);
    iVar4 = uVar3 * a->imm;
    iVar1 = -iVar4;
    if (a->d == 0) {
      iVar1 = iVar4;
    }
    ret = cpu_reg_aarch64(s,a->rd);
    tcg_gen_addi_i64_aarch64(tcg_ctx,ret,ret,(long)iVar1);
    return (_Bool)extraout_AL;
  }
  return _Var2;
}

Assistant:

static bool trans_INCDEC_r(DisasContext *s, arg_incdec_cnt *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned fullsz = vec_full_reg_size(s);
        unsigned numelem = decode_pred_count(fullsz, a->pat, a->esz);
        int inc = numelem * a->imm * (a->d ? -1 : 1);
        TCGv_i64 reg = cpu_reg(s, a->rd);

        tcg_gen_addi_i64(tcg_ctx, reg, reg, inc);
    }
    return true;
}